

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::EmitBr(WasmBytecodeGenerator *this)

{
  WasmBinaryReader *pWVar1;
  BlockInfo *blockInfo;
  PolymorphicEmitInfo PVar2;
  undefined1 local_30 [8];
  PolymorphicEmitInfo info;
  
  pWVar1 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar1 == (WasmBinaryReader *)0x0) {
    pWVar1 = (this->m_module->m_reader).ptr;
  }
  blockInfo = GetBlockInfo(this,(pWVar1->super_WasmReaderBase).m_currentNode.field_1.brTable.
                                numTargets);
  if ((blockInfo->yieldInfo).count != 0) {
    PVar2 = PopStackPolymorphic(this,blockInfo,(char16 *)0x0);
    info._0_8_ = PVar2.field_1;
    local_30._0_4_ = PVar2.count;
    PVar2._4_4_ = 0;
    PVar2.count = local_30._0_4_;
    PVar2.field_1 =
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
    YieldToBlock(this,blockInfo,PVar2);
    ReleaseLocation(this,(PolymorphicEmitInfo *)local_30);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)blockInfo->label,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBr()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    BlockInfo* blockInfo = GetBlockInfo(depth);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(blockInfo->label);
    SetUnreachableState(true);
}